

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

VkResult __thiscall
VmaAllocator_T::AllocateDedicatedMemoryPage
          (VmaAllocator_T *this,VmaPool pool,VkDeviceSize size,VmaSuballocationType suballocType,
          uint32_t memTypeIndex,VkMemoryAllocateInfo *allocInfo,bool map,bool isUserDataString,
          bool isMappingAllowed,void *pUserData,VmaAllocation *pAllocation)

{
  VmaAllocation pVVar1;
  VmaSuballocationType in_ECX;
  VmaCurrentBudgetData *in_RDX;
  VmaPool in_RSI;
  VmaAllocator in_RDI;
  uint32_t in_R8D;
  byte in_stack_00000008;
  byte in_stack_00000010;
  void *in_stack_00000020;
  void *pMappedData;
  VkResult res;
  VkDeviceMemory hMemory;
  VkDeviceMemory *in_stack_00000140;
  VkMemoryAllocateInfo *in_stack_00000148;
  VmaAllocator_T *in_stack_00000150;
  char *in_stack_ffffffffffffff90;
  VmaCurrentBudgetData *allocationSize;
  undefined4 in_stack_ffffffffffffff98;
  VmaSuballocationType heapIndex;
  VmaCurrentBudgetData *this_00;
  VmaAllocationObjectAllocator *this_01;
  VmaAllocator_T *this_02;
  VkResult local_4;
  
  this_02 = (VmaAllocator_T *)0x0;
  heapIndex = in_ECX;
  this_00 = in_RDX;
  local_4 = AllocateVulkanMemory(in_stack_00000150,in_stack_00000148,in_stack_00000140);
  if (VK_ERROR_OUT_OF_HOST_MEMORY < local_4) {
    this_01 = (VmaAllocationObjectAllocator *)0x0;
    if (((in_stack_00000008 & 1) == 0) ||
       (local_4 = (*(in_RDI->m_VulkanFunctions).vkMapMemory)
                            (in_RDI->m_hDevice,(VkDeviceMemory)this_02,0,0xffffffffffffffff,0,
                             (void **)&stack0xffffffffffffffb0),
       VK_ERROR_OUT_OF_HOST_MEMORY < local_4)) {
      pVVar1 = VmaAllocationObjectAllocator::Allocate<bool&>(this_01,&in_RDI->m_UseMutex);
      *(VmaAllocation *)pMappedData = pVVar1;
      VmaAllocation_T::InitDedicatedAllocation
                (*pMappedData,in_RSI,in_R8D,(VkDeviceMemory)this_02,in_ECX,this_01,
                 (VkDeviceSize)in_RDX);
      if ((in_stack_00000010 & 1) == 0) {
        VmaAllocation_T::SetUserData(*pMappedData,in_RDI,in_stack_00000020);
      }
      else {
        VmaAllocation_T::SetName
                  ((VmaAllocation_T *)this_00,
                   (VmaAllocator)CONCAT44(heapIndex,in_stack_ffffffffffffff98),
                   in_stack_ffffffffffffff90);
      }
      allocationSize = &in_RDI->m_Budget;
      MemoryTypeIndexToHeapIndex(in_RDI,in_R8D);
      VmaCurrentBudgetData::AddAllocation(this_00,heapIndex,(VkDeviceSize)allocationSize);
      local_4 = VK_SUCCESS;
    }
    else {
      FreeVulkanMemory(this_02,local_4,(VkDeviceSize)this_01,(VkDeviceMemory)in_RDI);
    }
  }
  return local_4;
}

Assistant:

VkResult VmaAllocator_T::AllocateDedicatedMemoryPage(
    VmaPool pool,
    VkDeviceSize size,
    VmaSuballocationType suballocType,
    uint32_t memTypeIndex,
    const VkMemoryAllocateInfo& allocInfo,
    bool map,
    bool isUserDataString,
    bool isMappingAllowed,
    void* pUserData,
    VmaAllocation* pAllocation)
{
    VkDeviceMemory hMemory = VK_NULL_HANDLE;
    VkResult res = AllocateVulkanMemory(&allocInfo, &hMemory);
    if(res < 0)
    {
        VMA_DEBUG_LOG("    vkAllocateMemory FAILED");
        return res;
    }

    void* pMappedData = VMA_NULL;
    if(map)
    {
        res = (*m_VulkanFunctions.vkMapMemory)(
            m_hDevice,
            hMemory,
            0,
            VK_WHOLE_SIZE,
            0,
            &pMappedData);
        if(res < 0)
        {
            VMA_DEBUG_LOG("    vkMapMemory FAILED");
            FreeVulkanMemory(memTypeIndex, size, hMemory);
            return res;
        }
    }

    *pAllocation = m_AllocationObjectAllocator.Allocate(isMappingAllowed);
    (*pAllocation)->InitDedicatedAllocation(pool, memTypeIndex, hMemory, suballocType, pMappedData, size);
    if (isUserDataString)
        (*pAllocation)->SetName(this, (const char*)pUserData);
    else
        (*pAllocation)->SetUserData(this, pUserData);
    m_Budget.AddAllocation(MemoryTypeIndexToHeapIndex(memTypeIndex), size);
    if(VMA_DEBUG_INITIALIZE_ALLOCATIONS)
    {
        FillAllocation(*pAllocation, VMA_ALLOCATION_FILL_PATTERN_CREATED);
    }

    return VK_SUCCESS;
}